

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiWindow *pIVar1;
  ImFontAtlas *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  float fVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  GImGui->Font = font;
  fVar5 = (pIVar3->IO).FontGlobalScale * font->FontSize * font->Scale;
  fVar4 = 1.0;
  if (1.0 <= fVar5) {
    fVar4 = fVar5;
  }
  pIVar3->FontBaseSize = fVar4;
  pIVar1 = pIVar3->CurrentWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = fVar4 * pIVar1->FontWindowScale;
    if (pIVar1->ParentWindow != (ImGuiWindow *)0x0) {
      fVar4 = fVar4 * pIVar1->ParentWindow->FontWindowScale;
    }
  }
  pIVar3->FontSize = fVar4;
  pIVar2 = font->ContainerAtlas;
  (pIVar3->DrawListSharedData).TexUvWhitePixel = pIVar2->TexUvWhitePixel;
  (pIVar3->DrawListSharedData).TexUvLines = pIVar2->TexUvLines;
  (pIVar3->DrawListSharedData).Font = font;
  (pIVar3->DrawListSharedData).FontSize = fVar4;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}